

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O1

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  int iVar1;
  TValue *obj;
  
  obj = index2addr(L,idx);
  if ((obj->tt_ & 0xfU) != 4) {
    iVar1 = luaV_tostring(L,obj);
    if (iVar1 == 0) {
      if (len != (size_t *)0x0) {
        *len = 0;
      }
      return (char *)0x0;
    }
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    obj = index2addr(L,idx);
  }
  if (len != (size_t *)0x0) {
    *len = *(size_t *)((obj->value_).f + 0x10);
  }
  return (char *)((obj->value_).f + 0x18);
}

Assistant:

LUA_API const char *lua_tolstring (lua_State *L, int idx, size_t *len) {
  StkId o = index2addr(L, idx);
  if (!ttisstring(o)) {
    lua_lock(L);  /* `luaV_tostring' may create a new string */
    if (!luaV_tostring(L, o)) {  /* conversion failed? */
      if (len != NULL) *len = 0;
      lua_unlock(L);
      return NULL;
    }
    luaC_checkGC(L);
    o = index2addr(L, idx);  /* previous call may reallocate the stack */
    lua_unlock(L);
  }
  if (len != NULL) *len = tsvalue(o)->len;
  return svalue(o);
}